

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_hash.cpp
# Opt level: O2

int __thiscall
sc_core::sc_phash_base::remove_by_contents
          (sc_phash_base *this,_func_bool_void_ptr_void_ptr *predicate,void *arg)

{
  bool bVar1;
  long lVar2;
  int iVar3;
  sc_phash_elem **ppsVar4;
  sc_phash_elem *p;
  
  iVar3 = 0;
  for (lVar2 = 0; lVar2 < this->num_bins; lVar2 = lVar2 + 1) {
    ppsVar4 = this->bins + lVar2;
    p = *ppsVar4;
    while (p != (sc_phash_elem *)0x0) {
      bVar1 = (*predicate)(p->contents,arg);
      if (bVar1) {
        *ppsVar4 = p->next;
        sc_mempool::release(p,0x18);
        p = *ppsVar4;
        this->num_entries = this->num_entries + -1;
        iVar3 = iVar3 + 1;
      }
      else {
        ppsVar4 = &p->next;
        p = p->next;
      }
    }
  }
  return iVar3;
}

Assistant:

int
sc_phash_base::remove_by_contents( bool (*predicate)(const void* c, void* arg), void* arg )
{
    sc_phash_elem** last;
    sc_phash_elem*  ptr;

    int num_removed = 0;
    for (int i = 0; i < num_bins; ++i) {
        last = &(bins[i]);
        ptr = *last;
        while (ptr != 0) {
            if (! (*predicate)(ptr->contents, arg)) {
                last = &(ptr->next);
                ptr  = *last;
            }
            else {
                *last = ptr->next;
                delete ptr;
                ptr = *last;
                --num_entries;
                ++num_removed;
            }
        }
    }
    return num_removed;
}